

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O3

float gimage::getMutualInformationU8
                (ImageFloat *mi,ImageU8 *image1,ImageU8 *image2,ImageFloat *disp,int channel)

{
  uchar ***pppuVar1;
  uchar ***pppuVar2;
  uchar *puVar3;
  uchar *puVar4;
  float ***pppfVar5;
  float **ppfVar6;
  int iVar7;
  float *pfVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  double dVar20;
  GaussKernel gk;
  ImageFloat P;
  ImageFloat Pg1;
  ImageFloat P1;
  ImageFloat Pg;
  double local_148;
  double local_140;
  GaussKernel local_138;
  ImageU8 *local_128;
  float ***local_120;
  ImageFloat *local_118;
  Image<float,_gimage::PixelTraits<float>_> local_110;
  Image<float,_gimage::PixelTraits<float>_> local_d8;
  Image<float,_gimage::PixelTraits<float>_> local_a0;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_110.depth = 0;
  local_110.width = 0;
  local_110.height = 0;
  local_110.n = 0;
  local_110.pixel = (float *)0x0;
  local_110.row = (float **)0x0;
  local_110.img = (float ***)0x0;
  local_128 = image2;
  local_118 = mi;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_110,0x100,0x100,1);
  if (local_110.n != 0) {
    lVar11 = -local_110.n;
    if (0 < local_110.n) {
      lVar11 = local_110.n;
    }
    memset(local_110.pixel,0,lVar11 << 2);
  }
  lVar11 = disp->width;
  if ((lVar11 < 1) || (lVar16 = disp->height, lVar16 < 1)) {
    lVar11 = image1->width;
    if (local_128->width < image1->width) {
      lVar11 = local_128->width;
    }
    lVar16 = image1->height;
    if (local_128->height < image1->height) {
      lVar16 = local_128->height;
    }
    if (0 < local_110.depth) {
      iVar7 = 0;
      do {
        if (0 < lVar16) {
          pppuVar1 = image1->img;
          pppuVar2 = local_128->img;
          lVar13 = 0;
          do {
            if (0 < lVar11) {
              puVar3 = pppuVar1[channel][(int)lVar13];
              puVar4 = pppuVar2[channel][(int)lVar13];
              ppfVar6 = *local_110.img;
              lVar15 = 0;
              lVar12 = lVar11;
              do {
                ppfVar6[puVar4[lVar15 >> 0x20]][puVar3[lVar15 >> 0x20]] =
                     ppfVar6[puVar4[lVar15 >> 0x20]][puVar3[lVar15 >> 0x20]] + 1.0;
                lVar15 = lVar15 + 0x100000000;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != lVar16);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != local_110.depth);
    }
    fVar19 = 1.0 / (float)(lVar16 * lVar11);
    local_128 = (ImageU8 *)CONCAT44(local_128._4_4_,fVar19);
    operator*=(&local_110,(double)fVar19);
  }
  else {
    lVar13 = image1->width;
    if (local_128->width < image1->width) {
      lVar13 = local_128->width;
    }
    if (lVar13 <= lVar11) {
      lVar11 = lVar13;
    }
    lVar12 = image1->height;
    if (local_128->height < image1->height) {
      lVar12 = local_128->height;
    }
    if (lVar12 <= lVar16) {
      lVar16 = lVar12;
    }
    if (lVar12 < 1) {
      fVar19 = 0.0;
    }
    else {
      local_120 = disp->img;
      lVar12 = 0;
      lVar15 = 0;
      do {
        if (0 < lVar13) {
          iVar7 = (int)lVar15;
          pfVar8 = (*local_120)[iVar7];
          pppuVar1 = local_128->img;
          pppuVar2 = image1->img;
          lVar10 = 0;
          lVar17 = 0;
          do {
            fVar19 = *(float *)((long)pfVar8 + (lVar10 >> 0x1e));
            if (((uint)ABS(fVar19) < 0x7f800000) && (fVar19 < (float)lVar17)) {
              fVar19 = (float)lVar17 - fVar19;
              fVar19 = fVar19 - (float)(long)fVar19;
              (*local_110.img)
              [(int)(((1.0 - fVar19) * (float)pppuVar1[channel][iVar7][lVar10 >> 0x20] +
                     fVar19 * (float)pppuVar1[channel][iVar7][lVar10 >> 0x20]) * 0.5 + 0.5)]
              [pppuVar2[channel][iVar7][lVar10 >> 0x20]] =
                   (*local_110.img)
                   [(int)(((1.0 - fVar19) * (float)pppuVar1[channel][iVar7][lVar10 >> 0x20] +
                          fVar19 * (float)pppuVar1[channel][iVar7][lVar10 >> 0x20]) * 0.5 + 0.5)]
                   [pppuVar2[channel][iVar7][lVar10 >> 0x20]] + 1.0;
              lVar12 = lVar12 + 1;
            }
            lVar17 = lVar17 + 1;
            lVar10 = lVar10 + 0x100000000;
          } while (lVar11 != lVar17);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar16);
      fVar19 = (float)lVar12;
    }
    local_128 = (ImageU8 *)CONCAT44(local_128._4_4_,1.0 / fVar19);
    operator*=(&local_110,(double)(1.0 / fVar19));
  }
  if (0 < local_110.height) {
    lVar11 = 0;
    do {
      if (0 < local_110.width) {
        pfVar8 = (*local_110.img)[(int)lVar11];
        lVar13 = 0;
        lVar16 = local_110.width;
        do {
          fVar19 = *(float *)((long)pfVar8 + (lVar13 >> 0x1e));
          if ((fVar19 == 0.0) && (!NAN(fVar19))) {
            *(float *)((long)pfVar8 + (lVar13 >> 0x1e)) = local_128._0_4_;
          }
          lVar13 = lVar13 + 0x100000000;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != local_110.height);
  }
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_68,0,0,1);
  gauss<float>(&local_68,&local_110,1.0);
  if (local_68.height < 1) {
    local_148 = 0.0;
  }
  else {
    pfVar8 = **local_68.img;
    local_148 = 0.0;
    lVar13 = 0;
    lVar11 = local_68.width;
    lVar16 = local_68.height;
    do {
      if (0 < lVar11) {
        lVar12 = 0;
        do {
          fVar18 = logf(*pfVar8);
          fVar19 = *pfVar8;
          *pfVar8 = -fVar18;
          local_148 = local_148 - (double)(fVar18 * fVar19);
          pfVar8 = pfVar8 + 1;
          lVar12 = lVar12 + 1;
          lVar11 = local_68.width;
          lVar16 = local_68.height;
        } while (lVar12 < local_68.width);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < lVar16);
  }
  gauss<float>(local_118,&local_68,1.0);
  local_a0.depth = 0;
  local_a0.width = 0;
  local_a0.height = 0;
  local_a0.n = 0;
  local_a0.pixel = (float *)0x0;
  local_a0.row = (float **)0x0;
  local_a0.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_a0,local_110.width,1,1);
  if (0 < local_110.width) {
    pfVar8 = **local_a0.img;
    lVar11 = 0;
    do {
      if (local_110.height < 1) {
        lVar16 = (long)(int)lVar11 << 2;
        fVar19 = 0.0;
      }
      else {
        lVar16 = (long)(int)lVar11 * 4;
        fVar19 = 0.0;
        lVar12 = 0;
        lVar13 = local_110.height;
        do {
          fVar19 = fVar19 + *(float *)(*(long *)((long)*local_110.img + (lVar12 >> 0x1d)) + lVar16);
          lVar12 = lVar12 + 0x100000000;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      *(float *)((long)pfVar8 + lVar16) = fVar19;
      lVar11 = lVar11 + 1;
    } while (lVar11 != local_110.width);
  }
  local_138.kernel = (float *)0x0;
  local_138.kn = 0;
  local_138.kn2 = 0;
  GaussKernel::set(&local_138,1.0);
  local_d8.depth = 0;
  local_d8.width = 0;
  local_d8.height = 0;
  local_d8.n = 0;
  local_d8.pixel = (float *)0x0;
  local_d8.row = (float **)0x0;
  local_d8.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_d8,local_110.width,1,1);
  if (local_a0.width < 1) {
    pfVar8 = **local_d8.img;
  }
  else {
    pfVar8 = **local_d8.img;
    iVar7 = -local_138.kn2;
    lVar11 = 0;
    do {
      if (lVar11 < local_a0.width - local_138.kn2 && local_138.kn2 <= lVar11) {
        if (local_138.kn < 1) {
          fVar19 = 0.0;
        }
        else {
          fVar19 = 0.0;
          lVar16 = 0;
          do {
            fVar19 = fVar19 + local_138.kernel[lVar16] * (**local_a0.img)[iVar7 + lVar16];
            lVar16 = lVar16 + 1;
          } while (local_138.kn != lVar16);
        }
      }
      else {
        fVar19 = NAN;
        if (0 < local_138.kn) {
          fVar18 = 0.0;
          lVar16 = 0;
          fVar19 = 0.0;
          do {
            uVar14 = iVar7 + (int)lVar16;
            if ((-1 < (int)uVar14) &&
               (uVar9 = (ulong)(uVar14 & 0x7fffffff), (long)uVar9 < local_a0.width)) {
              fVar18 = fVar18 + local_138.kernel[lVar16];
              fVar19 = fVar19 + local_138.kernel[lVar16] * (**local_a0.img)[uVar9];
            }
            lVar16 = lVar16 + 1;
          } while (local_138.kn != lVar16);
          fVar19 = fVar19 / fVar18;
        }
      }
      pfVar8[(int)lVar11] = fVar19;
      lVar11 = lVar11 + 1;
      iVar7 = iVar7 + 1;
    } while (lVar11 != local_a0.width);
  }
  if (local_d8.width < 1) {
    local_140 = 0.0;
  }
  else {
    local_140 = 0.0;
    lVar11 = 0;
    do {
      fVar18 = logf(pfVar8[lVar11]);
      fVar19 = pfVar8[lVar11];
      pfVar8[lVar11] = -fVar18;
      local_140 = local_140 - (double)(fVar18 * fVar19);
      lVar11 = lVar11 + 1;
    } while (lVar11 < local_d8.width);
    if (0 < local_d8.width) {
      local_120 = local_d8.img;
      pppfVar5 = local_118->img;
      iVar7 = -local_138.kn2;
      lVar11 = 0;
      do {
        if (lVar11 < local_d8.width - local_138.kn2 && local_138.kn2 <= lVar11) {
          if (local_138.kn < 1) {
            fVar19 = 0.0;
          }
          else {
            fVar19 = 0.0;
            lVar16 = 0;
            do {
              fVar19 = fVar19 + local_138.kernel[lVar16] * (**local_d8.img)[iVar7 + lVar16];
              lVar16 = lVar16 + 1;
            } while (local_138.kn != lVar16);
          }
        }
        else {
          fVar19 = NAN;
          if (0 < local_138.kn) {
            fVar18 = 0.0;
            lVar16 = 0;
            fVar19 = 0.0;
            do {
              uVar14 = iVar7 + (int)lVar16;
              if ((-1 < (int)uVar14) &&
                 (uVar9 = (ulong)(uVar14 & 0x7fffffff), (long)uVar9 < local_d8.width)) {
                fVar18 = fVar18 + local_138.kernel[lVar16];
                fVar19 = fVar19 + local_138.kernel[lVar16] * (**local_d8.img)[uVar9];
              }
              lVar16 = lVar16 + 1;
            } while (local_138.kn != lVar16);
            fVar19 = fVar19 / fVar18;
          }
        }
        if (0 < local_110.height) {
          ppfVar6 = *pppfVar5;
          lVar12 = (long)(int)lVar11 * 4;
          lVar13 = 0;
          lVar16 = local_110.height;
          do {
            lVar15 = *(long *)((long)ppfVar6 + (lVar13 >> 0x1d));
            *(float *)(lVar15 + lVar12) = fVar19 - *(float *)(lVar15 + lVar12);
            lVar13 = lVar13 + 0x100000000;
            lVar16 = lVar16 + -1;
          } while (lVar16 != 0);
        }
        lVar11 = lVar11 + 1;
        iVar7 = iVar7 + 1;
      } while (lVar11 != local_d8.width);
    }
  }
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_a0,local_110.height,1,1);
  if (0 < local_110.height) {
    pfVar8 = **local_a0.img;
    lVar11 = 0;
    do {
      if (local_110.width < 1) {
        fVar19 = 0.0;
      }
      else {
        fVar19 = 0.0;
        lVar13 = 0;
        lVar16 = local_110.width;
        do {
          fVar19 = fVar19 + *(float *)(*(long *)((long)*local_110.img + ((lVar11 << 0x20) >> 0x1d))
                                      + (lVar13 >> 0x1e));
          lVar13 = lVar13 + 0x100000000;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      *(float *)((long)pfVar8 + ((lVar11 << 0x20) >> 0x1e)) = fVar19;
      lVar11 = lVar11 + 1;
    } while (lVar11 != local_110.height);
  }
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_d8,local_110.height,1,1);
  dVar20 = 0.0;
  if (0 < local_d8.width) {
    pfVar8 = **local_d8.img;
    iVar7 = -local_138.kn2;
    lVar11 = 0;
    do {
      if ((lVar11 < local_138.kn2) || (local_a0.width - local_138.kn2 <= lVar11)) {
        fVar19 = NAN;
        if (0 < local_138.kn) {
          fVar18 = 0.0;
          lVar16 = 0;
          fVar19 = 0.0;
          do {
            uVar14 = iVar7 + (int)lVar16;
            if ((-1 < (int)uVar14) &&
               (uVar9 = (ulong)(uVar14 & 0x7fffffff), (long)uVar9 < local_a0.width)) {
              fVar18 = fVar18 + local_138.kernel[lVar16];
              fVar19 = fVar19 + local_138.kernel[lVar16] * (**local_a0.img)[uVar9];
            }
            lVar16 = lVar16 + 1;
          } while (local_138.kn != lVar16);
          fVar19 = fVar19 / fVar18;
        }
      }
      else if (local_138.kn < 1) {
        fVar19 = 0.0;
      }
      else {
        fVar19 = 0.0;
        lVar16 = 0;
        do {
          fVar19 = fVar19 + local_138.kernel[lVar16] * (**local_a0.img)[iVar7 + lVar16];
          lVar16 = lVar16 + 1;
        } while (local_138.kn != lVar16);
      }
      pfVar8[(int)lVar11] = fVar19;
      lVar11 = lVar11 + 1;
      iVar7 = iVar7 + 1;
    } while (lVar11 != local_d8.width);
    if (0 < local_d8.width) {
      pfVar8 = **local_d8.img;
      dVar20 = 0.0;
      lVar11 = 0;
      do {
        fVar18 = logf(pfVar8[lVar11]);
        fVar19 = pfVar8[lVar11];
        pfVar8[lVar11] = -fVar18;
        dVar20 = dVar20 - (double)(fVar18 * fVar19);
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_d8.width);
      if (0 < local_d8.width) {
        local_120 = (float ***)(local_d8.width - local_138.kn2);
        pppfVar5 = local_118->img;
        iVar7 = -local_138.kn2;
        lVar11 = 0;
        do {
          if (lVar11 < (long)local_120 && local_138.kn2 <= lVar11) {
            if (local_138.kn < 1) {
              fVar19 = 0.0;
            }
            else {
              fVar19 = 0.0;
              lVar16 = 0;
              do {
                fVar19 = fVar19 + local_138.kernel[lVar16] * (**local_d8.img)[iVar7 + lVar16];
                lVar16 = lVar16 + 1;
              } while (local_138.kn != lVar16);
            }
          }
          else {
            fVar19 = NAN;
            if (0 < local_138.kn) {
              fVar18 = 0.0;
              lVar16 = 0;
              fVar19 = 0.0;
              do {
                uVar14 = iVar7 + (int)lVar16;
                if ((-1 < (int)uVar14) &&
                   (uVar9 = (ulong)(uVar14 & 0x7fffffff), (long)uVar9 < local_d8.width)) {
                  fVar18 = fVar18 + local_138.kernel[lVar16];
                  fVar19 = fVar19 + local_138.kernel[lVar16] * (**local_d8.img)[uVar9];
                }
                lVar16 = lVar16 + 1;
              } while (local_138.kn != lVar16);
              fVar19 = fVar19 / fVar18;
            }
          }
          if (0 < local_110.width) {
            pfVar8 = (*pppfVar5)[(int)lVar11];
            lVar13 = 0;
            lVar16 = local_110.width;
            do {
              *(float *)((long)pfVar8 + (lVar13 >> 0x1e)) =
                   *(float *)((long)pfVar8 + (lVar13 >> 0x1e)) + fVar19;
              lVar13 = lVar13 + 0x100000000;
              lVar16 = lVar16 + -1;
            } while (lVar16 != 0);
          }
          lVar11 = lVar11 + 1;
          iVar7 = iVar7 + 1;
        } while (lVar11 != local_d8.width);
      }
    }
  }
  operator*=(local_118,(double)local_128._0_4_);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_d8);
  if (local_138.kernel != (float *)0x0) {
    operator_delete__(local_138.kernel);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_a0);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_110);
  return (float)((local_140 + dVar20) - local_148);
}

Assistant:

float getMutualInformationU8(ImageFloat &mi, const ImageU8 &image1, const ImageU8 &image2,
  const ImageFloat &disp, int channel)
{
  ImageFloat P(256, 256, 1);
  P=0;

  // For computation of mutual information, see Hirschmueller (2008, TPAMI) or
  // Hirschmueller (2005, CVPR).

  // compute joint probabilities P_I1,I2

  float scale; // 1/number_of_correspondences

  if (disp.getWidth() > 0 && disp.getHeight() > 0)
  {
    long width=std::min(std::min(image1.getWidth(), image2.getWidth()), disp.getWidth());
    long height=std::min(std::min(image1.getHeight(), image2.getHeight()), disp.getHeight());
    long n=0;

    for (long k=0; k<height; k++)
    {
      for (long i=0; i<width; i++)
      {
        float v=disp(i, k, 0);

        if (disp.isValidS(v) && v < i)
        {
          v=i-v; // pixel in right image
          long ii=static_cast<long>(v); // full pixel
          v-=ii; // fraction

          // get intensity frpm right image by linear interpolation
          v=0.5f*((1-v)*image2(i, k, channel)+v*image2(i, k, channel));

          // increment corresponding cell in joint histogram
          P(image1(i, k, channel), static_cast<int>(v+0.5f))++;

          n++;
        }
      }
    }

    scale=1.0f/n;
    P*=scale;
  }
  else
  {
    long width=std::min(image1.getWidth(), image2.getWidth());
    long height=std::min(image1.getHeight(), image2.getHeight());

    for (int d=0; d<P.getDepth(); d++)
    {
      for (long k=0; k<height; k++)
      {
        for (long i=0; i<width; i++)
        {
          // increment corresponding cell in joint histogram
          P(image1(i, k, channel), image2(i, k, channel))++;
        }
      }
    }

    scale=1.0f/(width*height);
    P*=scale;
  }

  // replace all cells with 0 by the smallest value to avoid computing log(0)

  for (long k=0; k<P.getHeight(); k++)
  {
    for (long i=0; i<P.getWidth(); i++)
    {
      if (P(i, k) == 0) P(i, k)=scale;
    }
  }

  // compute joint entropy h_I1,I2 = -Gauss_convolution(log(Gauss_convolution(P_I1,I2)))

  ImageFloat Pg;
  gauss(Pg, P, 1.0f);

  double entropy=0;
  float *pg=Pg.getPtr(0, 0);

  for (long k=0; k<Pg.getHeight(); k++)
  {
    for (long i=0; i<Pg.getWidth(); i++)
    {
      entropy+=negLog(*pg);
      pg++;
    }
  }

  gauss(mi, Pg, 1.0f);

  // sum over columns for getting probabilities of image1

  ImageFloat P1(P.getWidth(), 1, 1);

  for (long i=0; i<P.getWidth(); i++)
  {
    float sum=0;
    for (long k=0; k<P.getHeight(); k++) sum+=P(i, k);
    P1(i, 0)=sum;
  }

  // compute entropy for image1

  GaussKernel gk(1.0f);

  ImageFloat Pg1(P.getWidth(), 1, 1);
  for (long i=0; i<P1.getWidth(); i++) Pg1(i, 0)=gk.convolveHorizontal(P1, i, 0, 0);

  double entropy1=0;
  pg=Pg1.getPtr(0, 0);

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    entropy1+=negLog(*pg);
    pg++;
  }

  // convolve with Gauss again add to negative mi values

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    float v=gk.convolveHorizontal(Pg1, i, 0, 0);
    for (long k=0; k<P.getHeight(); k++) mi(i, k)=v-mi(i, k);
  }

  // sum over rows for getting probabilities of image1

  P1.setSize(P.getHeight(), 1, 1);

  for (long k=0; k<P.getHeight(); k++)
  {
    float sum=0;
    for (long i=0; i<P.getWidth(); i++) sum+=P(i, k);
    P1(k, 0)=sum;
  }

  // compute entropy for image2

  Pg1.setSize(P.getHeight(), 1, 1);
  for (long i=0; i<Pg1.getWidth(); i++) Pg1(i, 0)=gk.convolveHorizontal(P1, i, 0, 0);

  double entropy2=0;
  pg=Pg1.getPtr(0, 0);

  for (long i=0; i<Pg1.getWidth(); i++)
  {
    entropy2+=negLog(*pg);
    pg++;
  }

  // convolve with Gauss again add to mi values

  for (long k=0; k<Pg1.getWidth(); k++)
  {
    float v=gk.convolveHorizontal(Pg1, k, 0, 0);
    for (long i=0; i<P.getWidth(); i++) mi(i, k)+=v;
  }

  // apply 1/n

  mi*=scale;

  return static_cast<float>(entropy1+entropy2-entropy);
}